

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_resetDStream(ZSTD_DStream *dctx)

{
  dctx->streamStage = zdss_init;
  dctx->noForwardProgress = 0;
  if (dctx->format < 2) {
    return (ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1;
  }
  __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                ,0xeb,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
}

Assistant:

size_t ZSTD_resetDStream(ZSTD_DStream* dctx)
{
    DEBUGLOG(4, "ZSTD_resetDStream");
    FORWARD_IF_ERROR(ZSTD_DCtx_reset(dctx, ZSTD_reset_session_only), "");
    return ZSTD_startingInputLength(dctx->format);
}